

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFusage.c
# Opt level: O0

uint64_t NFusage_worker(char *name,int mode)

{
  ulong uVar1;
  NF_link_map *pNVar2;
  char *pcVar3;
  uint64_t uVar4;
  uint64_t local_390;
  Elf64_Addr total;
  NF_list *iter;
  char *real_name;
  Elf64_Addr maplength;
  Elf64_Ehdr *ehdr;
  size_t retlen;
  filebuf fb;
  int fd;
  int mode_local;
  char *name_local;
  
  fb.buf._828_4_ = mode;
  fb.buf._824_4_ = open(name,0);
  if (fb.buf._824_4_ == -1) {
    printf("In mapping %s as an NF: file not found\n",name);
  }
  head = (NF_list *)calloc(0x20,1);
  tail = head;
  read(fb.buf._824_4_,&fb,0x340);
  uVar1 = (ulong)(ushort)fb.buf._48_2_;
  pNVar2 = (NF_link_map *)calloc(0x298,1);
  head->map = pNVar2;
  head->fd = fb.buf._824_4_;
  pcVar3 = strdup(name);
  head->map->l_name = pcVar3;
  head->map->l_phnum = fb.buf._48_2_;
  head->map->l_phlen = uVar1 * 0x38;
  head->map->l_phoff = fb.buf._24_8_;
  init_system_path();
  local_390 = 0;
  for (total = (Elf64_Addr)head; total != 0; total = *(Elf64_Addr *)(total + 8)) {
    uVar4 = dissect_and_calculate((NF_list *)total);
    local_390 = uVar4 + local_390;
  }
  return local_390;
}

Assistant:

uint64_t NFusage_worker(const char *name, int mode)
{
    /* examine the full dependency list, and calculate the space needed
     * look into the header of everything on the list
     * The list is declared by the head and tail pointer. In this function
     * the list is built, and later it is used to do the reloc for everything
     * before NFopen returns, the list should be freed.
     */
    int fd = open(name, O_RDONLY);
    if (fd == -1)
    {
        //check the DT_RUNPATH of current map
        printf("In mapping %s as an NF: file not found\n", name);
    }
    //set head and tail when cold start
    head = calloc(sizeof(struct NF_list), 1);
    tail = head;

    //fill in info needed for dissect
    struct filebuf fb;
    fb.len = 0;
    size_t retlen = read(fd, fb.buf, sizeof(fb.buf) - fb.len);
    Elf64_Ehdr *ehdr = (Elf64_Ehdr *)fb.buf;
    Elf64_Addr maplength = ehdr->e_phnum * sizeof(Elf64_Phdr);

    //allocate the link map early, and fill in some info
    head->map = calloc(sizeof(struct NF_link_map), 1);
    head->fd = fd;
    char *real_name = strdup(name); //don't forget to free it when destroying a link_map!
    head->map->l_name = real_name;
    head->map->l_phnum = ehdr->e_phnum;
    head->map->l_phlen = maplength;
    head->map->l_phoff = ehdr->e_phoff;

    //not useful for we're using calloc
    //head->next = NULL;
    init_system_path(); //init default search path before actually working
    struct NF_list *iter = head;
    Elf64_Addr total = 0;
    while (iter != NULL)
    {
        total += dissect_and_calculate(iter);
        iter = iter->next;
    }

    return total;
}